

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImU32 col;
  ImGuiContext *pIVar10;
  ImVec2 IVar11;
  float fVar12;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec4 local_48;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if ((type == (char *)0x0) ||
     (((GImGui->DragDropPayload).DataFrameCount != -1 &&
      (iVar9 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar9 == 0)))) {
    IVar2 = pIVar8->DragDropTargetId;
    IVar3 = pIVar8->DragDropAcceptIdPrev;
    IVar5 = (pIVar8->DragDropTargetRect).Min;
    IVar11 = (pIVar8->DragDropTargetRect).Max;
    local_58.x = IVar5.x;
    local_58.y = IVar5.y;
    IStack_50.x = IVar11.x;
    IStack_50.y = IVar11.y;
    fVar12 = (IStack_50.y - local_58.y) * (IStack_50.x - local_58.x);
    if (fVar12 <= pIVar8->DragDropAcceptIdCurrRectSurface) {
      pIVar8->DragDropAcceptFlags = flags;
      pIVar8->DragDropAcceptIdCurr = IVar2;
      pIVar8->DragDropAcceptIdCurrRectSurface = fVar12;
    }
    (pIVar8->DragDropPayload).Preview = IVar3 == IVar2;
    if (((pIVar8->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar2) {
      local_58.x = local_58.x + -3.5;
      local_58.y = local_58.y + -3.5;
      IStack_50.x = IStack_50.x + 3.5;
      IStack_50.y = IStack_50.y + 3.5;
      if ((((local_58.x < (pIVar4->ClipRect).Min.x) || (local_58.y < (pIVar4->ClipRect).Min.y)) ||
          ((pIVar4->ClipRect).Max.x < IStack_50.x)) ||
         (bVar1 = true, pIVar10 = pIVar8, (pIVar4->ClipRect).Max.y < IStack_50.y)) {
        IVar11.x = IStack_50.x + 1.0;
        IVar11.y = IStack_50.y + 1.0;
        bVar1 = false;
        IVar5.y = local_58.y + -1.0;
        IVar5.x = local_58.x + -1.0;
        ImDrawList::PushClipRect(pIVar4->DrawList,IVar5,IVar11,false);
        pIVar10 = GImGui;
      }
      this = pIVar4->DrawList;
      local_48.x = (pIVar10->Style).Colors[0x2b].x;
      local_48.y = (pIVar10->Style).Colors[0x2b].y;
      uVar6 = (pIVar10->Style).Colors[0x2b].z;
      uVar7 = (pIVar10->Style).Colors[0x2b].w;
      local_48.w = (pIVar10->Style).Alpha * (float)uVar7;
      local_48.z = (float)uVar6;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&IStack_50,col,0.0,-1,2.0);
      if (!bVar1) {
        ImDrawList::PopClipRect(pIVar4->DrawList);
      }
    }
    pIVar8->DragDropAcceptFrameCount = pIVar8->FrameCount;
    if (IVar3 == IVar2) {
      bVar1 = (GImGui->IO).MouseDown[pIVar8->DragDropMouseButton];
      (pIVar8->DragDropPayload).Delivery = (bool)(bVar1 ^ 1);
      if ((((uint)flags >> 10 & 1) != 0) || (bVar1 == false)) {
LAB_0012d7ba:
        return &pIVar8->DragDropPayload;
      }
    }
    else {
      (pIVar8->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) goto LAB_0012d7ba;
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}